

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int on_ack_max_streams(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,
                      quicly_sent_t *sent)

{
  quicly_maxsender_sent_t *sent_00;
  quicly_maxsender_t *m;
  
  m = (quicly_maxsender_t *)
      ((long)&map->head + ((ulong)((sent->data).max_streams.uni == 0) << 5 | 0xffffffffffffff48));
  sent_00 = &(sent->data).max_stream_data.args;
  if (acked == 0) {
    quicly_maxsender_lost(m,sent_00);
  }
  else {
    quicly_maxsender_acked(m,sent_00);
  }
  return 0;
}

Assistant:

static int on_ack_max_streams(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_maxsender_t *maxsender = sent->data.max_streams.uni ? &conn->ingress.max_streams.uni : &conn->ingress.max_streams.bidi;
    assert(maxsender != NULL); /* we would only receive an ACK if we have sent the frame */

    if (acked) {
        quicly_maxsender_acked(maxsender, &sent->data.max_streams.args);
    } else {
        quicly_maxsender_lost(maxsender, &sent->data.max_streams.args);
    }

    return 0;
}